

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O1

ssize_t __thiscall slang::TimeTrace::Profiler::write(Profiler *this,int __fd,void *__buf,size_t __n)

{
  pointer pEVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  id id;
  undefined4 extraout_var;
  Profiler *pPVar6;
  undefined4 in_register_00000034;
  ostream *poVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer pEVar8;
  string_view src;
  string_view src_00;
  string_view fmt;
  format_args args;
  int nextThreadId;
  anon_class_16_2_334a61d8 getTID;
  flat_hash_map<std::thread::id,_int> threadIdMap;
  string local_130;
  string local_110;
  string local_f0;
  int local_cc;
  anon_class_16_2_334a61d8 local_c8;
  flat_hash_map<std::thread::id,_int> local_b8;
  int local_88 [4];
  long local_78;
  long local_68;
  pointer local_58;
  size_type sStack_50;
  pointer local_48;
  size_type sStack_40;
  
  poVar7 = (ostream *)CONCAT44(in_register_00000034,__fd);
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mut);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  local_c8.threadIdMap = &local_b8;
  local_b8.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_slang::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  .arrays.groups_size_index = 0x3f;
  local_b8.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_slang::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  .arrays.groups_size_mask = 1;
  local_b8.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_slang::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_b8.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_slang::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_b8.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_slang::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  .size_ctrl.ml = 0;
  local_b8.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_slang::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  .size_ctrl.size = 0;
  local_c8.nextThreadId = &local_cc;
  local_cc = 0;
  id._M_thread = pthread_self();
  write::anon_class_16_2_334a61d8::operator()(&local_c8,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{ \"traceEvents\": [\n",0x13);
  pEVar1 = (this->entries).super__Vector_base<slang::Entry,_std::allocator<slang::Entry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar8 = (this->entries).super__Vector_base<slang::Entry,_std::allocator<slang::Entry>_>.
                _M_impl.super__Vector_impl_data._M_start; pEVar8 != pEVar1; pEVar8 = pEVar8 + 1) {
    lVar2 = (pEVar8->start).__d.__r;
    lVar3 = (this->startTime).__d.__r;
    lVar4 = (pEVar8->duration).__r;
    pPVar6 = this;
    iVar5 = write::anon_class_16_2_334a61d8::operator()(&local_c8,(id)(pEVar8->threadId)._M_thread);
    src._M_str = (char *)pPVar6;
    src._M_len = (size_t)(pEVar8->name)._M_dataplus._M_p;
    escapeString_abi_cxx11_(&local_f0,(slang *)(pEVar8->name)._M_string_length,src);
    src_00._M_str = (char *)pPVar6;
    src_00._M_len = (size_t)(pEVar8->detail)._M_dataplus._M_p;
    escapeString_abi_cxx11_(&local_110,(slang *)(pEVar8->detail)._M_string_length,src_00);
    local_78 = (lVar2 - lVar3) / 1000;
    local_68 = lVar4 / 1000;
    local_58 = local_f0._M_dataplus._M_p;
    sStack_50 = local_f0._M_string_length;
    local_48 = local_110._M_dataplus._M_p;
    sStack_40 = local_110._M_string_length;
    fmt.size_ = 0xdd331;
    fmt.data_ = (char *)0x5f;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_88;
    local_88[0] = iVar5;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_130,
               (v11 *)
               "{{ \"pid\":1, \"tid\":{}, \"ph\":\"X\", \"ts\":{}, \"dur\":{}, \"name\":\"{}\", \"args\":{{ \"detail\":\"{}\" }} }},\n"
               ,fmt,args);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,local_130._M_dataplus._M_p,local_130._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "{ \"cat\":\"\", \"pid\":1, \"tid\":0, \"ts\":0, \"ph\":\"M\", \"name\":\"process_name\", \"args\":{ \"name\":\"slang\" } }\n"
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] }\n",4);
  if (local_b8.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_slang::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
      .arrays.elements_ != (value_type_pointer)0x0) {
    operator_delete(local_b8.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_slang::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                    .arrays.elements_,
                    local_b8.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_slang::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                    .arrays.groups_size_mask * 0x100 + 0x100);
  }
  iVar5 = pthread_mutex_unlock((pthread_mutex_t *)&this->mut);
  return CONCAT44(extraout_var,iVar5);
}

Assistant:

void write(std::ostream& os) {
        SLANG_ASSERT(stack.empty());
        std::scoped_lock<std::mutex> lock(mut);

        // std::thread::id isn't convertible to an integer, so put it in
        // a table to generate nice ids for output.
        flat_hash_map<std::thread::id, int> threadIdMap;
        int nextThreadId = 0;
        auto getTID = [&](std::thread::id id) {
            auto [it, inserted] = threadIdMap.try_emplace(id, nextThreadId);
            if (inserted)
                ++nextThreadId;
            return it->second;
        };

        // Make sure this thread (presumably the main thread) has ID 0.
        getTID(std::this_thread::get_id());

        os << "{ \"traceEvents\": [\n";

        for (auto& entry : entries) {
            auto startUs = duration_cast<microseconds>(entry.start - startTime).count();
            auto durationUs = duration_cast<microseconds>(entry.duration).count();
            os << fmt::format("{{ \"pid\":1, \"tid\":{}, \"ph\":\"X\", \"ts\":{}, "
                              "\"dur\":{}, \"name\":\"{}\", \"args\":{{ \"detail\":\"{}\" }} }},\n",
                              getTID(entry.threadId), startUs, durationUs, escapeString(entry.name),
                              escapeString(entry.detail));
        }

        // Emit metadata event with process name.
        os << "{ \"cat\":\"\", \"pid\":1, \"tid\":0, \"ts\":0, \"ph\":\"M\", "
              "\"name\":\"process_name\", \"args\":{ \"name\":\"slang\" } }\n";
        os << "] }\n";
    }